

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O2

Context __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
::
RunConversion<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AbsId>>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
           *this,CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>
                 *con,int i,int depth)

{
  Context CVar1;
  NodeRange NVar2;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  auto_link_scope;
  
  *(int *)(this + 0xb38) = depth + 1;
  if ((con->super_FunctionalConstraint).ctx.value_ == CTX_NONE) {
    (con->super_FunctionalConstraint).ctx.value_ = CTX_MIX;
  }
  NVar2 = pre::ValueNode::Select((ValueNode *)(this + 0x1c88),i,1);
  *(NodeRange *)(this + 0xa50) = NVar2;
  auto_link_scope.cvt_ =
       (FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        *)this;
  CVar1 = BasicFuncConstrCvt<mp::AbsConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
          ::
          Convert<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AbsId>>
                    ((BasicFuncConstrCvt<mp::AbsConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
                      *)(this + 0x7be8),con,i);
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(&auto_link_scope);
  return (Context)CVar1.value_;
}

Assistant:

Context RunConversion(const Constraint& con, int i, int depth) {
    assert(
        !GET_CONSTRAINT_KEEPER(Constraint).IsRedundant(i));
    constr_depth_ = depth+1;
    if (con.UsesContext())              // If context relevant,
      if (con.GetContext().IsNone())    // ensure we have context, mixed if none
        con.SetContext(Context::CTX_MIX);
    pre::AutoLinkScope<Impl> auto_link_scope{
      *static_cast<Impl*>(this),
      GET_CONSTRAINT_KEEPER(Constraint).SelectValueNodeRange(i)
    };
    return MP_DISPATCH(Convert(con, i));
  }